

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.h
# Opt level: O0

void __thiscall game::game(game *this,bitboards newBoards)

{
  game *this_local;
  
  bitboards::bitboards(&this->boards);
  std::stack<bitboards,std::deque<bitboards,std::allocator<bitboards>>>::
  stack<std::deque<bitboards,std::allocator<bitboards>>,void>
            ((stack<bitboards,std::deque<bitboards,std::allocator<bitboards>>> *)&this->boardHistory
            );
  std::stack<move,std::deque<move,std::allocator<move>>>::
  stack<std::deque<move,std::allocator<move>>,void>
            ((stack<move,std::deque<move,std::allocator<move>>> *)&this->history);
  this->blacksTurn = false;
  memcpy(this,&newBoards,100);
  return;
}

Assistant:

game(bitboards newBoards) {
    boards = newBoards;
  }